

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O0

string * __thiscall helics::InputInfo::getInjectionUnits_abi_cxx11_(InputInfo *this)

{
  bool bVar1;
  __type_conflict _Var2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  sourceInformation *src_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
  *__range4;
  sourceInformation *src;
  const_iterator __end3;
  const_iterator __begin3;
  vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
  *__range3;
  bool allTheSame;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  char cVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  reference local_50;
  sourceInformation *local_48;
  __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
  local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  reference local_30;
  sourceInformation *local_28;
  __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
  local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  byte local_9;
  
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5b0e78);
  if ((bVar1) &&
     (bVar1 = std::
              vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
              ::empty((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                       *)in_stack_ffffffffffffff70), !bVar1)) {
    local_9 = 1;
    local_18 = in_RDI + 7;
    local_20._M_current =
         (sourceInformation *)
         std::
         vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
         ::begin((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                  *)in_stack_ffffffffffffff58);
    local_28 = (sourceInformation *)
               std::
               vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               ::end((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                      *)in_stack_ffffffffffffff58);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                        ((__normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                          *)in_stack_ffffffffffffff60,
                         (__normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                          *)in_stack_ffffffffffffff58);
      cVar4 = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_30 = __gnu_cxx::
                 __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                 ::operator*(&local_20);
      in_stack_ffffffffffffff70 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30->units;
      std::
      vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
      ::front((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               *)in_stack_ffffffffffffff60);
      _Var2 = std::operator==(in_stack_ffffffffffffff80,in_RDI);
      cVar4 = (char)((ulong)in_stack_ffffffffffffff68 >> 0x38);
      if (((_Var2 ^ 0xffU) & 1) != 0) {
        local_9 = 0;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
      ::operator++(&local_20);
    }
    if ((local_9 & 1) == 0) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(in_stack_ffffffffffffff70,cVar4);
      local_38 = in_RDI + 7;
      local_40._M_current =
           (sourceInformation *)
           std::
           vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
           ::begin((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                    *)in_stack_ffffffffffffff58);
      local_48 = (sourceInformation *)
                 std::
                 vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                 ::end((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                        *)in_stack_ffffffffffffff58);
      while (bVar1 = __gnu_cxx::
                     operator==<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                               ((__normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                                 *)in_stack_ffffffffffffff60,
                                (__normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                                 *)in_stack_ffffffffffffff58), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_50 = __gnu_cxx::
                   __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
                   ::operator*(&local_40);
        in_stack_ffffffffffffff60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RDI[9]._M_string_length;
        __str = &local_70;
        generateJsonQuotedString(in_stack_ffffffffffffff88);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (in_stack_ffffffffffffff70,__str);
        cVar4 = (char)((ulong)__str >> 0x38);
        std::__cxx11::string::~string(in_stack_ffffffffffffff60);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(in_stack_ffffffffffffff70,cVar4);
        __gnu_cxx::
        __normal_iterator<const_helics::InputInfo::sourceInformation_*,_std::vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>_>
        ::operator++(&local_40);
      }
      pvVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::back(in_stack_ffffffffffffff60);
      *pvVar3 = ']';
    }
    else {
      std::
      vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
      ::front((vector<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
               *)in_stack_ffffffffffffff60);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
  }
  return (string *)&in_RDI[9]._M_string_length;
}

Assistant:

const std::string& InputInfo::getInjectionUnits() const
{
    if (inputUnits.empty()) {
        if (!source_info.empty()) {
            bool allTheSame{true};
            for (const auto& src : source_info) {
                if (src.units != source_info.front().units) {
                    allTheSame = false;
                    break;
                }
            }
            if (allTheSame) {
                inputUnits = source_info.front().units;
            } else {
                inputUnits.push_back('[');
                for (const auto& src : source_info) {
                    inputUnits.append(generateJsonQuotedString(src.units));
                    inputUnits.push_back(',');
                }
                inputUnits.back() = ']';
            }
        }
    }
    return inputUnits;
}